

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   HighsInt value)

{
  HighsOptionType HVar1;
  OptionRecordDouble *option;
  OptionStatus OVar2;
  HighsInt index;
  int local_2c;
  double local_28;
  
  OVar2 = getOptionIndex(report_log_options,name,option_records,&local_2c);
  if (OVar2 != kOk) {
    return OVar2;
  }
  option = (OptionRecordDouble *)
           (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
           _M_impl.super__Vector_impl_data._M_start[local_2c];
  HVar1 = (option->super_OptionRecord).type;
  if (HVar1 == kInt) {
    OVar2 = checkOptionValue(report_log_options,(OptionRecordInt *)option,value);
    if (OVar2 != kOk) {
      return OVar2;
    }
    *(HighsInt *)option->value = value;
  }
  else {
    if (HVar1 != kDouble) {
      highsLogUser(report_log_options,kError,
                   "setLocalOptionValue: Option \"%s\" cannot be assigned an int\n",
                   (name->_M_dataplus)._M_p);
      return kIllegalValue;
    }
    local_28 = (double)value;
    OVar2 = checkOptionValue(report_log_options,option,local_28);
    if (OVar2 != kOk) {
      return OVar2;
    }
    *option->value = local_28;
  }
  return kOk;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 std::vector<OptionRecord*>& option_records,
                                 const HighsInt value) {
  HighsInt index;
  //  printf("setLocalOptionValue: \"%s\" with HighsInt %" HIGHSINT_FORMAT "\n",
  //  name.c_str(), value);
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kInt) {
    if (type == HighsOptionType::kDouble) {
      // Interpret integer as double
      double use_value = value;
      return setLocalOptionValue(
          report_log_options, ((OptionRecordDouble*)option_records[index])[0],
          use_value);
    }
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "setLocalOptionValue: Option \"%s\" cannot be assigned an int\n",
        name.c_str());
    return OptionStatus::kIllegalValue;
  }
  return setLocalOptionValue(
      report_log_options, ((OptionRecordInt*)option_records[index])[0], value);
}